

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFromInnerLoop<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::TypeHandler>
          (RepeatedPtrFieldBase *this,void **our_elems,void **other_elems,int length,
          int already_allocated)

{
  Arena *this_00;
  ItemSimilarityRecommender_ConnectedItem *from;
  uint uVar1;
  ItemSimilarityRecommender_ConnectedItem *this_01;
  long lVar2;
  ulong uVar3;
  
  uVar1 = length;
  if (already_allocated < length) {
    uVar1 = already_allocated;
  }
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      GenericTypeHandler<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::Merge
                ((ItemSimilarityRecommender_ConnectedItem *)other_elems[uVar3],
                 (ItemSimilarityRecommender_ConnectedItem *)our_elems[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (already_allocated < length) {
    this_00 = this->arena_;
    lVar2 = 0;
    do {
      from = (ItemSimilarityRecommender_ConnectedItem *)other_elems[already_allocated + lVar2];
      if (this_00 == (Arena *)0x0) {
        this_01 = (ItemSimilarityRecommender_ConnectedItem *)operator_new(0x28);
        CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::
        ItemSimilarityRecommender_ConnectedItem(this_01);
      }
      else {
        this_01 = (ItemSimilarityRecommender_ConnectedItem *)
                  Arena::AllocateAligned
                            (this_00,(type_info *)
                                     &CoreML::Specification::ItemSimilarityRecommender_ConnectedItem
                                      ::typeinfo,0x28);
        CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::
        ItemSimilarityRecommender_ConnectedItem(this_01);
        Arena::AddListNode(this_00,this_01,
                           arena_destruct_object<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>
                          );
      }
      GenericTypeHandler<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::Merge
                (from,this_01);
      our_elems[already_allocated + lVar2] = this_01;
      lVar2 = lVar2 + 1;
    } while (length - already_allocated != (int)lVar2);
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromInnerLoop(
    void** our_elems, void** other_elems, int length, int already_allocated) {
  // Split into two loops, over ranges [0, allocated) and [allocated, length),
  // to avoid a branch within the loop.
  for (int i = 0; i < already_allocated && i < length; i++) {
    // Already allocated: use existing element.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        reinterpret_cast<typename TypeHandler::Type*>(our_elems[i]);
    TypeHandler::Merge(*other_elem, new_elem);
  }
  Arena* arena = GetArenaNoVirtual();
  for (int i = already_allocated; i < length; i++) {
    // Not allocated: alloc a new element first, then merge it.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        TypeHandler::NewFromPrototype(other_elem, arena);
    TypeHandler::Merge(*other_elem, new_elem);
    our_elems[i] = new_elem;
  }
}